

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ErrorWriteDetails(Parser *this)

{
  bool bVar1;
  bool bVar2;
  pointer pSVar3;
  size_type sVar4;
  char *pcVar5;
  char *local_e8;
  bool local_c9;
  ulong local_c0;
  size_t i;
  String markerText;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_80;
  SymbolListCItr curr;
  String symbolText;
  size_t endIndex;
  size_t lastErrorIndex;
  size_t errorIndex;
  const_iterator cStack_38;
  bool foundError;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_30;
  SymbolListCItr end;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_20;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_18;
  SymbolListCItr start;
  Parser *this_local;
  
  local_18._M_current = (this->m_currentSymbol)._M_current;
  start._M_current = (Symbol *)this;
  local_20._M_current =
       (Symbol *)
       std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                 (this->m_symbolList);
  bVar1 = __gnu_cxx::operator==(&local_18,&local_20);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator--(&local_18);
  }
  pSVar3 = __gnu_cxx::
           __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
           ::operator->(&local_18);
  if (pSVar3->type == NewLine) {
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator--(&local_18);
  }
  while( true ) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&local_18);
    local_c9 = false;
    if (pSVar3->type != NewLine) {
      end._M_current =
           (Symbol *)
           std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::begin
                     (this->m_symbolList);
      local_c9 = __gnu_cxx::operator!=(&local_18,&end);
    }
    if (local_c9 == false) break;
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator--(&local_18);
  }
  pSVar3 = __gnu_cxx::
           __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
           ::operator->(&local_18);
  if (pSVar3->type == NewLine) {
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++(&local_18);
  }
  local_30._M_current = local_18._M_current;
  while( true ) {
    cStack_38 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    bVar2 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
    bVar1 = false;
    if (bVar2) {
      pSVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&local_30);
      bVar1 = pSVar3->type != NewLine;
    }
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++(&local_30);
  }
  bVar1 = false;
  lastErrorIndex = 0;
  endIndex = 0;
  symbolText.field_2._8_8_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&curr);
  local_80._M_current = local_18._M_current;
  while (bVar2 = __gnu_cxx::operator!=(&local_80,&local_30), bVar2) {
    WriteSymbol((SymbolListCItr)local_80._M_current,(String *)&curr);
    bVar2 = __gnu_cxx::operator==(&local_80,&this->m_currentSymbol);
    if (bVar2) {
      bVar1 = true;
    }
    if (!bVar1) {
      endIndex = lastErrorIndex;
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&curr
                        );
      lastErrorIndex = sVar4 + lastErrorIndex;
    }
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&curr);
    symbolText.field_2._8_8_ = symbolText.field_2._8_8_ + sVar4;
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&curr)
    ;
    LogWrite(Error,pcVar5);
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++(&local_80);
  }
  if (symbolText.field_2._8_8_ != 0) {
    symbolText.field_2._8_8_ = symbolText.field_2._8_8_ + -1;
  }
  if ((ulong)symbolText.field_2._8_8_ <= lastErrorIndex) {
    lastErrorIndex = endIndex;
  }
  LogWrite(Error,"\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i,0x20);
  for (local_c0 = 0; local_c0 < (ulong)symbolText.field_2._8_8_; local_c0 = local_c0 + 1) {
    if (local_c0 < lastErrorIndex) {
      local_e8 = " ";
    }
    else {
      local_e8 = "^";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i,local_e8);
  }
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  LogWriteLine(Error,pcVar5);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&curr);
  return;
}

Assistant:

inline_t void Parser::ErrorWriteDetails() const
	{
		// Write line of code containing error

		// Find starting symbol of error line.  Harder than you might think
		auto start = m_currentSymbol;
		if (start == m_symbolList.end())
			--start;
		if (start->type == SymbolType::NewLine)
			--start;
		while (start->type != SymbolType::NewLine && start != m_symbolList.begin())
			--start;
		if (start->type == SymbolType::NewLine)
			++start;

		// Once we find the supposed start, find the end from that location
		auto end = start;
		while (end != m_symbolList.end() && end->type != SymbolType::NewLine)
			++end;

		// Print out the symbols and find error start index
		bool foundError = false;
		size_t errorIndex = 0;
		size_t lastErrorIndex = 0;
		size_t endIndex = 0;
		String symbolText;
		for (auto curr = start; curr != end; ++curr)
		{
			WriteSymbol(curr, symbolText);
			if (curr == m_currentSymbol)
				foundError = true;
			if (!foundError)
			{
				lastErrorIndex = errorIndex;
				errorIndex += symbolText.size();
			}
			endIndex += symbolText.size();
			LogWrite(LogLevel::Error, symbolText.c_str());
		}
		if (endIndex)
			--endIndex;
		if (errorIndex >= endIndex)
			errorIndex = lastErrorIndex;
		LogWrite(LogLevel::Error, "\n");

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < endIndex; ++i)
			markerText += (i < errorIndex) ? " " : "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}